

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

void Abc_SclTimeNodePrint(SC_Man *p,Abc_Obj_t *pObj,int fRise,int Length,float maxDelay)

{
  float fVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  float fVar12;
  undefined4 in_XMM0_Db;
  double dVar13;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    uVar10 = (ulong)pObj->Id;
    if ((long)uVar10 < 0) {
LAB_003f5cc1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pVVar3 = pObj->pNtk->vGates;
    if (pVVar3->nSize <= pObj->Id) goto LAB_003f5cc1;
    uVar9 = pVVar3->pArray[uVar10];
    if ((ulong)uVar9 == 0xffffffff) goto LAB_003f5960;
    if (((int)uVar9 < 0) ||
       (pvVar4 = pObj->pNtk->pSCLib, *(int *)((long)pvVar4 + 100) <= (int)uVar9)) goto LAB_003f5ca2;
    puVar11 = *(undefined8 **)(*(long *)((long)pvVar4 + 0x68) + (ulong)uVar9 * 8);
  }
  else {
    uVar10 = (ulong)(uint)pObj->Id;
LAB_003f5960:
    puVar11 = (undefined8 *)0x0;
  }
  printf("%8d : ",CONCAT44(in_XMM0_Db,maxDelay),uVar10);
  printf("%d ",(ulong)(uint)(pObj->vFanins).nSize);
  printf("%4d ",(ulong)(uint)(pObj->vFanouts).nSize);
  if (puVar11 == (undefined8 *)0x0) {
    printf("%-*s ",(ulong)(uint)Length,"pi");
    dVar13 = 0.0;
  }
  else {
    printf("%-*s ",(ulong)(uint)Length,*puVar11);
    dVar13 = (double)*(float *)(puVar11 + 3);
  }
  printf("A =%7.2f  ",dVar13);
  pcVar6 = " TXr; >Xrs Yqo o!Yq oHYq oqYa 7Yq Y87q 7HYq Ya7q SoYq YqoS! oZYq YqaoZ rY r";
  if (fRise == 0) {
    pcVar6 = "Xe 1XJe J18Xe IXeG0K I!XKGe0 JTXe0 aXeJT0 1GIXje 8eGj1IX J1TXe sJ1Xe IXf0 f";
  }
  uVar9 = 0;
  printf("D%s =",pcVar6 + 0x4a);
  fVar12 = p->pTimes[(uint)pObj->Id].rise;
  fVar1 = p->pTimes[(uint)pObj->Id].fall;
  if (fVar12 <= fVar1) {
    fVar12 = fVar1;
  }
  printf("%6.1f",(double)fVar12);
  fVar12 = p->pTimes[(uint)pObj->Id].fall - p->pTimes[(uint)pObj->Id].rise;
  if (-fVar12 <= fVar12) {
    fVar12 = -fVar12;
  }
  printf("%7.1f ps  ",(double)fVar12);
  fVar12 = p->pSlews[(uint)pObj->Id].rise;
  fVar1 = p->pSlews[(uint)pObj->Id].fall;
  if (fVar12 <= fVar1) {
    fVar12 = fVar1;
  }
  printf("S =%6.1f ps  ",(double)fVar12);
  if (puVar11 == (undefined8 *)0x0) {
    printf("Cin =%5.1f ff  ",0);
    fVar12 = p->pLoads[(uint)pObj->Id].rise;
    fVar1 = p->pLoads[(uint)pObj->Id].fall;
    if (fVar12 <= fVar1) {
      fVar12 = fVar1;
    }
    printf("Cout =%6.1f ff  ",(double)fVar12);
    printf("Cmax =%6.1f ff  ",0);
  }
  else {
    iVar2 = *(int *)(puVar11 + 8);
    if ((long)iVar2 < 1) {
      fVar12 = 0.0;
    }
    else {
      uVar9 = 0;
      if (0 < (int)*(uint *)((long)puVar11 + 0x34)) {
        uVar9 = *(uint *)((long)puVar11 + 0x34);
      }
      if (uVar9 <= iVar2 - 1U) goto LAB_003f5ca2;
      fVar12 = 0.0;
      lVar8 = 0;
      do {
        lVar5 = *(long *)(puVar11[7] + lVar8 * 8);
        fVar12 = fVar12 + *(float *)(lVar5 + 0x10) * 0.5 + *(float *)(lVar5 + 0x14) * 0.5;
        lVar8 = lVar8 + 1;
      } while (iVar2 != lVar8);
    }
    iVar7 = 1;
    if (1 < iVar2) {
      iVar7 = iVar2;
    }
    printf("Cin =%5.1f ff  ",(double)(fVar12 / (float)iVar7));
    fVar12 = p->pLoads[(uint)pObj->Id].rise;
    fVar1 = p->pLoads[(uint)pObj->Id].fall;
    if (fVar12 <= fVar1) {
      fVar12 = fVar1;
    }
    printf("Cout =%6.1f ff  ",(double)fVar12);
    iVar2 = *(int *)(puVar11 + 8);
    if (((long)iVar2 < 0) || (*(int *)((long)puVar11 + 0x34) <= iVar2)) {
LAB_003f5ca2:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    printf("Cmax =%6.1f ff  ",(double)*(float *)(*(long *)(puVar11[7] + (long)iVar2 * 8) + 0x20));
    iVar2 = *(int *)(puVar11 + 8);
    if ((long)iVar2 < 1) {
      fVar12 = 0.0;
    }
    else {
      uVar9 = 0;
      if (0 < (int)*(uint *)((long)puVar11 + 0x34)) {
        uVar9 = *(uint *)((long)puVar11 + 0x34);
      }
      if (uVar9 <= iVar2 - 1U) goto LAB_003f5ca2;
      fVar12 = 0.0;
      lVar8 = 0;
      do {
        lVar5 = *(long *)(puVar11[7] + lVar8 * 8);
        fVar12 = fVar12 + *(float *)(lVar5 + 0x10) * 0.5 + *(float *)(lVar5 + 0x14) * 0.5;
        lVar8 = lVar8 + 1;
      } while (iVar2 != lVar8);
    }
    iVar7 = 1;
    if (1 < iVar2) {
      iVar7 = iVar2;
    }
    uVar9 = (uint)(((p->pLoads[(uint)pObj->Id].rise * 0.5 + p->pLoads[(uint)pObj->Id].fall * 0.5) *
                   100.0) / (fVar12 / (float)iVar7));
  }
  printf("G =%5d  ",(ulong)uVar9);
  putchar(10);
  return;
}

Assistant:

static inline void Abc_SclTimeNodePrint( SC_Man * p, Abc_Obj_t * pObj, int fRise, int Length, float maxDelay )
{
    SC_Cell * pCell = Abc_ObjIsNode(pObj) ? Abc_SclObjCell(pObj) : NULL;
    printf( "%8d : ",           Abc_ObjId(pObj) );
    printf( "%d ",              Abc_ObjFaninNum(pObj) );
    printf( "%4d ",             Abc_ObjFanoutNum(pObj) );
    printf( "%-*s ",            Length, pCell ? pCell->pName : "pi" );
    printf( "A =%7.2f  ",       pCell ? pCell->area : 0.0 );
    printf( "D%s =",            fRise ? "r" : "f" );
    printf( "%6.1f",            Abc_SclObjTimeMax(p, pObj) );
    printf( "%7.1f ps  ",       -Abc_AbsFloat(Abc_SclObjTimeOne(p, pObj, 0) - Abc_SclObjTimeOne(p, pObj, 1)) );
    printf( "S =%6.1f ps  ",    Abc_SclObjSlewMax(p, pObj) );
    printf( "Cin =%5.1f ff  ",  pCell ? SC_CellPinCapAve(pCell) : 0.0 );
    printf( "Cout =%6.1f ff  ", Abc_SclObjLoadMax(p, pObj) );
    printf( "Cmax =%6.1f ff  ", pCell ? SC_CellPin(pCell, pCell->n_inputs)->max_out_cap : 0.0 );
    printf( "G =%5d  ",         pCell ? (int)(100.0 * Abc_SclObjLoadAve(p, pObj) / SC_CellPinCapAve(pCell)) : 0 );
//    printf( "SL =%6.1f ps",     Abc_SclObjSlackMax(p, pObj, p->MaxDelay0) );
    printf( "\n" );
}